

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

bool __thiscall ArgsManager::UseDefaultSection(ArgsManager *this,string *arg)

{
  __type_conflict2 _Var1;
  size_type sVar2;
  long in_FS_OFFSET;
  bool bVar3;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ChainTypeToString_abi_cxx11_(&local_50,MAIN);
  _Var1 = std::operator==(&this->m_network,&local_50);
  bVar3 = true;
  if (!_Var1) {
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->m_network_only_args,arg);
    bVar3 = sVar2 == 0;
  }
  std::__cxx11::string::~string((string *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::UseDefaultSection(const std::string& arg) const
{
    return m_network == ChainTypeToString(ChainType::MAIN) || m_network_only_args.count(arg) == 0;
}